

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O1

bool __thiscall ON_Object::ThisIsNullptr(ON_Object *this,bool bSilentError)

{
  return false;
}

Assistant:

bool ON_Object::ThisIsNullptr(
  bool bSilentError
) const
{
  // CLang warns that these tests may be omitted because in "well-defined C++ code"
  // they are always false. 
  //
  // Earth to CLang: 
  //   This tool to find code that is not well formed, alert us to that fact, 
  //   but not potentiall not crash so our loyal customers don't loose their work.
  //
  // return (this == nullptr);
  // return ( nullptr == this );
  if (0 != ((ON__UINT_PTR)this))
    return false;

  if (false == bSilentError)
    ON_ERROR("this is nullptr.");

  return true;
}